

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O0

void __thiscall KDReports::TextElement::TextElement(TextElement *this,TextElement *other)

{
  TextElementPrivate *this_00;
  type pTVar1;
  TextElement *other_local;
  TextElement *this_local;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__TextElement_001c81b0;
  this_00 = (TextElementPrivate *)operator_new(0x80);
  pTVar1 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator*(&other->d);
  TextElementPrivate::TextElementPrivate(this_00,pTVar1);
  std::unique_ptr<KDReports::TextElementPrivate,std::default_delete<KDReports::TextElementPrivate>>
  ::unique_ptr<std::default_delete<KDReports::TextElementPrivate>,void>
            ((unique_ptr<KDReports::TextElementPrivate,std::default_delete<KDReports::TextElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::TextElement::TextElement(const TextElement &other)
    : Element(other)
    , d(new TextElementPrivate(*other.d))
{
}